

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaper.cpp
# Opt level: O0

void __thiscall zmq::reaper_t::in_event(reaper_t *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  long in_RDI;
  undefined8 in_R8;
  char *errstr;
  int rc;
  command_t cmd;
  command_t *in_stack_ffffffffffffff10;
  object_t *in_stack_ffffffffffffff18;
  undefined1 local_c0 [184];
  
  while( true ) {
    do {
      uVar1 = *(uint *)(in_RDI + 0xe8);
      uVar2 = getpid();
      if (uVar1 != uVar2) {
        return;
      }
      sVar4 = mailbox_t::recv((mailbox_t *)(in_RDI + 0x20),(int)local_c0,(void *)0x0,(ulong)uVar2,
                              (int)in_R8);
      iVar3 = (int)sVar4;
    } while ((iVar3 != 0) && (piVar5 = __errno_location(), *piVar5 == 4));
    if ((iVar3 != 0) && (piVar5 = __errno_location(), *piVar5 == 0xb)) break;
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      in_R8 = 0x65;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/reaper.cpp"
             );
      fflush(_stderr);
      zmq_abort((char *)0x2cb12c);
    }
    object_t::process_command(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void zmq::reaper_t::in_event ()
{
    while (true) {
#ifdef HAVE_FORK
        if (unlikely (_pid != getpid ())) {
            //printf("zmq::reaper_t::in_event return in child process %d\n", (int)getpid());
            return;
        }
#endif

        //  Get the next command. If there is none, exit.
        command_t cmd;
        const int rc = _mailbox.recv (&cmd, 0);
        if (rc != 0 && errno == EINTR)
            continue;
        if (rc != 0 && errno == EAGAIN)
            break;
        errno_assert (rc == 0);

        //  Process the command.
        cmd.destination->process_command (cmd);
    }
}